

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

Vector<double,_4U> * __thiscall
OpenMD::COHZ::calcCorrVal
          (Vector<double,_4U> *__return_storage_ptr__,COHZ *this,int frame1,int frame2,int id1,
          int id2)

{
  Vector<double,_4U> *pVVar1;
  DoublePolynomial *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3d h2;
  Vector3d h1;
  Vector3d v2z;
  Vector3d w2;
  Vector3d w1;
  Vector3d v1z;
  Vector3d v1y;
  Vector3d u2;
  Vector3d u1;
  Vector3d v2y;
  Vector<double,_3U> local_140;
  Vector<double,_4U> *local_128;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_128 = __return_storage_ptr__;
  RectMatrix<double,_3U,_3U>::getRow
            (&local_a8,
             (RectMatrix<double,_3U,_3U> *)
             (*(long *)&(this->rotMats_).
                        super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[frame1].
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data + (long)id1 * 0x48),this->yaxis_);
  Vector<double,_3U>::Vector(&local_90,&local_a8);
  RectMatrix<double,_3U,_3U>::getRow
            (&local_48,
             (RectMatrix<double,_3U,_3U> *)
             ((long)id1 * 0x48 +
             *(long *)&(this->rotMats_).
                       super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[frame1].
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data),this->axis_);
  Vector<double,_3U>::Vector(&local_a8,&local_48);
  RectMatrix<double,_3U,_3U>::getRow
            (&local_f0,
             (RectMatrix<double,_3U,_3U> *)
             (*(long *)&(this->rotMats_).
                        super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[frame2].
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data + (long)id2 * 0x48),this->yaxis_);
  Vector<double,_3U>::Vector(&local_48,&local_f0);
  RectMatrix<double,_3U,_3U>::getRow
            (&local_60,
             (RectMatrix<double,_3U,_3U> *)
             ((long)id2 * 0x48 +
             *(long *)&(this->rotMats_).
                       super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[frame2].
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data),this->axis_);
  Vector<double,_3U>::Vector(&local_f0,&local_60);
  operator*(&local_c0,0.81649,&local_90);
  operator*(&local_d8,0.57736,&local_a8);
  operator+(&local_78,&local_c0,&local_d8);
  Vector<double,_3U>::Vector(&local_60,&local_78);
  operator*(&local_d8,0.81649,&local_48);
  operator*(&local_108,0.57736,&local_f0);
  operator+(&local_c0,&local_d8,&local_108);
  Vector<double,_3U>::Vector(&local_78,&local_c0);
  operator*(&local_108,-0.81649,&local_90);
  operator*(&local_120,0.57736,&local_a8);
  operator+(&local_d8,&local_108,&local_120);
  Vector<double,_3U>::Vector(&local_c0,&local_d8);
  operator*(&local_120,-0.81649,&local_48);
  operator*(&local_140,0.57736,&local_f0);
  operator+(&local_108,&local_120,&local_140);
  Vector<double,_3U>::Vector(&local_d8,&local_108);
  operator*(&local_120,1.63298,&local_90);
  Vector<double,_3U>::Vector(&local_108,&local_120);
  operator*(&local_140,1.63298,&local_48);
  Vector<double,_3U>::Vector(&local_120,&local_140);
  pVVar1 = local_128;
  local_140.data_[0] = 0.0;
  Vector<double,_4U>::Vector(local_128,local_140.data_);
  this_00 = &this->legendre_;
  dVar2 = dot<double,3u>(&local_a8,&local_f0);
  dVar3 = Vector<double,_3U>::length(&local_a8);
  dVar4 = Vector<double,_3U>::length(&local_f0);
  local_140.data_[0] = dVar2 / (dVar4 * dVar3);
  dVar2 = Polynomial<double>::evaluate(this_00,local_140.data_);
  pVVar1->data_[0] = dVar2;
  dVar2 = dot<double,3u>(&local_60,&local_78);
  dVar3 = Vector<double,_3U>::length(&local_60);
  dVar4 = Vector<double,_3U>::length(&local_78);
  local_140.data_[0] = dVar2 / (dVar4 * dVar3);
  dVar2 = Polynomial<double>::evaluate(this_00,local_140.data_);
  pVVar1->data_[1] = dVar2;
  dVar2 = dot<double,3u>(&local_c0,&local_d8);
  dVar3 = Vector<double,_3U>::length(&local_c0);
  dVar4 = Vector<double,_3U>::length(&local_d8);
  local_140.data_[0] = dVar2 / (dVar4 * dVar3);
  dVar2 = Polynomial<double>::evaluate(this_00,local_140.data_);
  pVVar1->data_[2] = dVar2;
  dVar2 = dot<double,3u>(&local_108,&local_120);
  dVar3 = Vector<double,_3U>::length(&local_108);
  dVar4 = Vector<double,_3U>::length(&local_120);
  local_140.data_[0] = dVar2 / (dVar4 * dVar3);
  dVar2 = Polynomial<double>::evaluate(this_00,local_140.data_);
  pVVar1->data_[3] = dVar2;
  return pVVar1;
}

Assistant:

Vector<RealType, 4> COHZ::calcCorrVal(int frame1, int frame2, int id1,
                                        int id2) {
    // Vectors v1x, v1y, and v1z are the body-fixed axes on the
    // molecule in frame 1 in the laboratory frame.

    // Vectors v2x, v2y, and v2z are the body-fixed axes on the
    // molecule in frame 2 in the laboratory frame.

    // Vectors u1 & u2 are the first OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors w1 & w2 are the second OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors h1 & h2 are the HH bond vectors in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry again.

    // Vector3d v1x = sd1->getA(frame1).getRow(0);
    // Vector3d v2x = sd2->getA(frame2).getRow(0);

    Vector3d v1y = rotMats_[frame1][id1].getRow(yaxis_);
    Vector3d v1z = rotMats_[frame1][id1].getRow(axis_);

    Vector3d v2y = rotMats_[frame2][id2].getRow(yaxis_);
    Vector3d v2z = rotMats_[frame2][id2].getRow(axis_);

    Vector3d u1 = 0.81649 * v1y + 0.57736 * v1z;
    Vector3d u2 = 0.81649 * v2y + 0.57736 * v2z;

    Vector3d w1 = -0.81649 * v1y + 0.57736 * v1z;
    Vector3d w2 = -0.81649 * v2y + 0.57736 * v2z;

    Vector3d h1 = 1.63298 * v1y;
    Vector3d h2 = 1.63298 * v2y;

    // result is a Vector<RealType, 4> with Dipole, OH1, OH2, and HH:
    Vector<RealType, 4> r(0.0);
    r[0] = legendre_.evaluate(dot(v1z, v2z) / (v1z.length() * v2z.length()));
    r[1] = legendre_.evaluate(dot(u1, u2) / (u1.length() * u2.length()));
    r[2] = legendre_.evaluate(dot(w1, w2) / (w1.length() * w2.length()));
    r[3] = legendre_.evaluate(dot(h1, h2) / (h1.length() * h2.length()));
    return r;
  }